

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void GCTM(lua_State *L)

{
  l_uint32 *plVar1;
  byte bVar2;
  lu_byte lVar3;
  global_State *pgVar4;
  StkId pSVar5;
  TStatus TVar6;
  TValue *pTVar7;
  TValue v;
  
  pgVar4 = L->l_G;
  v.value_ = (Value)pgVar4->tobefnz;
  pgVar4->tobefnz = (v.value_.gc)->next;
  (v.value_.gc)->next = pgVar4->allgc;
  pgVar4->allgc = (GCObject *)v.value_;
  bVar2 = (v.value_.gc)->marked;
  (v.value_.gc)->marked = bVar2 & 0xbf;
  if ((byte)(pgVar4->gcstate - 3) < 4) {
    (v.value_.gc)->marked = pgVar4->currentwhite & 0x18 | bVar2 & 0x87;
  }
  else if ((bVar2 & 7) == 3) {
    pgVar4->firstold1 = (GCObject *)v.value_;
  }
  v.tt_ = (v.value_.gc)->tt | 0x40;
  pTVar7 = luaT_gettmbyobj(L,&v,TM_GC);
  if ((pTVar7->tt_ & 0xf) != 0) {
    lVar3 = L->allowhook;
    bVar2 = pgVar4->gcstp;
    pgVar4->gcstp = bVar2 | 2;
    L->allowhook = '\0';
    pSVar5 = (L->top).p;
    (L->top).p = pSVar5 + 1;
    (pSVar5->val).value_ = pTVar7->value_;
    (pSVar5->val).tt_ = pTVar7->tt_;
    pSVar5 = (L->top).p;
    (L->top).p = pSVar5 + 1;
    (pSVar5->val).value_ = v.value_;
    (pSVar5->val).tt_ = v.tt_;
    plVar1 = &L->ci->callstatus;
    *plVar1 = *plVar1 | 0x1000000;
    TVar6 = luaD_pcall(L,dothecall,(void *)0x0,(long)(L->top).p + (-0x20 - (L->stack).offset),0);
    plVar1 = &L->ci->callstatus;
    *plVar1 = *plVar1 & 0xfeffffff;
    L->allowhook = lVar3;
    pgVar4->gcstp = bVar2;
    if (TVar6 != '\0') {
      luaE_warnerror(L,"__gc");
      (L->top).p = (StkId)((L->top).offset + -0x10);
    }
  }
  return;
}

Assistant:

static void GCTM (lua_State *L) {
  global_State *g = G(L);
  const TValue *tm;
  TValue v;
  lua_assert(!g->gcemergency);
  setgcovalue(L, &v, udata2finalize(g));
  tm = luaT_gettmbyobj(L, &v, TM_GC);
  if (!notm(tm)) {  /* is there a finalizer? */
    TStatus status;
    lu_byte oldah = L->allowhook;
    lu_byte oldgcstp  = g->gcstp;
    g->gcstp |= GCSTPGC;  /* avoid GC steps */
    L->allowhook = 0;  /* stop debug hooks during GC metamethod */
    setobj2s(L, L->top.p++, tm);  /* push finalizer... */
    setobj2s(L, L->top.p++, &v);  /* ... and its argument */
    L->ci->callstatus |= CIST_FIN;  /* will run a finalizer */
    status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top.p - 2), 0);
    L->ci->callstatus &= ~CIST_FIN;  /* not running a finalizer anymore */
    L->allowhook = oldah;  /* restore hooks */
    g->gcstp = oldgcstp;  /* restore state */
    if (l_unlikely(status != LUA_OK)) {  /* error while running __gc? */
      luaE_warnerror(L, "__gc");
      L->top.p--;  /* pops error object */
    }
  }
}